

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenkoFPM.cpp
# Opt level: O2

ChMatrixNM<double,_6,_6> * __thiscall
chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::GetKlawAtPoint
          (ChMatrixNM<double,_6,_6> *__return_storage_ptr__,
          ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM *this,double eta)

{
  StorageBaseType *pSVar1;
  double Nx2;
  double Nx1;
  double local_e8;
  double local_e0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
  local_d8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
  local_b0;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>,_const_Eigen::Matrix<double,_6,_6,_1,_6,_6>_>_>_>
  local_88 [24];
  double local_70;
  RhsNested local_68;
  double local_48;
  RhsNested local_40;
  
  local_e0 = (1.0 - eta) * 0.5;
  local_e8 = (eta + 1.0) * 0.5;
  pSVar1 = (StorageBaseType *)
           (**(code **)(*(long *)(this->section_fpmA).
                                 super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 0x1b8))();
  Eigen::operator*(&local_b0,&local_e0,pSVar1);
  pSVar1 = (StorageBaseType *)
           (**(code **)(*(long *)(this->section_fpmB).
                                 super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 0x1b8))();
  Eigen::operator*(&local_d8,&local_e8,pSVar1);
  local_70 = local_b0.m_lhs.m_functor.m_other;
  local_68 = local_b0.m_rhs;
  local_48 = local_d8.m_lhs.m_functor.m_other;
  local_40 = local_d8.m_rhs;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,6,1,6,6>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,6,1,6,6>const>const,Eigen::Matrix<double,6,6,1,6,6>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,6,1,6,6>const>const,Eigen::Matrix<double,6,6,1,6,6>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,6,6,1,6,6>> *)__return_storage_ptr__,local_88);
  return __return_storage_ptr__;
}

Assistant:

ChMatrixNM<double, 6, 6> ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::GetKlawAtPoint(const double eta) {
    // calculate cross-sectional material stiffness matrix Klaw at dimensionless point eta, by linear interpolation
    // eta = (-1,1)
    double Nx1 = (1. / 2.) * (1 - eta);
    double Nx2 = (1. / 2.) * (1 + eta);
    ChMatrixNM<double, 6, 6> Klaw_point =
        Nx1 * this->section_fpmA->GetStiffnessMatrixFPM() + Nx2 * this->section_fpmB->GetStiffnessMatrixFPM();

    return Klaw_point;
}